

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::process_token_buff
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *ast)

{
  bool bVar1;
  signal_types sVar2;
  int iVar3;
  reference pptVar4;
  size_type sVar5;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_RSI;
  _Self *in_RDI;
  token_base **ptr_1;
  iterator __end1_1;
  iterator __begin1_1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range1_1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tmp;
  token_base **it;
  iterator __end4;
  iterator __begin4;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range4;
  token_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> expr;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> oldt;
  _Self *in_stack_fffffffffffffde8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffe10;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_1e0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_00;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_140;
  undefined1 *local_120;
  reference local_118;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_f0;
  undefined1 *local_d0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffff40;
  context_t *in_stack_ffffffffffffff48;
  translator_type *in_stack_ffffffffffffff50;
  undefined1 local_68 [88];
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *local_10;
  
  local_10 = in_RSI;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1b1ad9);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1b1ae6);
  std::swap<cs::token_base*,std::allocator<cs::token_base*>>
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_RDI,
             (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffde8
            );
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(in_stack_fffffffffffffe10);
  local_d0 = local_68;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffde8
            );
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_fffffffffffffde8
            );
  do {
    bVar1 = std::operator!=(in_RDI,in_stack_fffffffffffffde8);
    if (!bVar1) {
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1b1d90);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffde8);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_fffffffffffffde8);
      this_00 = local_10;
      while( true ) {
        bVar1 = std::operator!=(in_RDI,in_stack_fffffffffffffde8);
        if (!bVar1) break;
        pptVar4 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                  operator*(&local_1e0);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_RDI,
                   (value_type *)in_stack_fffffffffffffde8);
        if (*pptVar4 != (token_base *)0x0) {
          iVar3 = (*(*pptVar4)->_vptr_token_base[2])();
          if (iVar3 == 1) {
            sVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                               0x1b1e1d);
            if (1 < sVar5) {
              std::
              deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                           *)in_RDI,(value_type *)in_stack_fffffffffffffde8);
            }
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
                      (in_stack_fffffffffffffe10);
          }
        }
        std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
                  (in_RDI);
      }
      sVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1b1e7e);
      if (1 < sVar5) {
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)in_RDI,(value_type *)in_stack_fffffffffffffde8);
      }
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(this_00);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(this_00);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(this_00);
      return;
    }
    local_118 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                operator*(&local_f0);
    iVar3 = (*(*local_118)->_vptr_token_base[2])();
    if (iVar3 == 3) {
      sVar2 = token_signal::get_signal((token_signal *)*local_118);
      if (sVar2 == endline_) {
        in_stack_fffffffffffffde8 = (_Self *)token_base::operator_new((size_t)in_RDI);
        token_base::get_line_num(*local_118);
        token_endline::token_endline((token_endline *)in_RDI,(size_t)in_stack_fffffffffffffde8);
        *local_118 = (token_base *)in_stack_fffffffffffffde8;
      }
    }
    iVar3 = (*(*local_118)->_vptr_token_base[2])();
    if (iVar3 == 2) {
LAB_001b1c6d:
      bVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::empty
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x1b1c7a);
      if (!bVar1) {
        translator_type::match_grammar
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        local_120 = &stack0xffffffffffffff48;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffde8);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffde8);
        while( true ) {
          bVar1 = std::operator!=(in_RDI,in_stack_fffffffffffffde8);
          if (!bVar1) break;
          std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator*
                    (&local_140);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_RDI,
                     (value_type *)in_stack_fffffffffffffde8);
          std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
                    (in_RDI);
        }
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear
                  (in_stack_fffffffffffffe10);
      }
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_RDI,
                 (value_type *)in_stack_fffffffffffffde8);
    }
    else {
      iVar3 = (*(*local_118)->_vptr_token_base[2])();
      if (iVar3 == 1) goto LAB_001b1c6d;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_RDI,
                 (value_type *)in_stack_fffffffffffffde8);
    }
    std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++(in_RDI)
    ;
  } while( true );
}

Assistant:

void
	compiler_type::process_token_buff(std::deque<token_base *> &tokens, std::deque<std::deque<token_base *>> &ast)
	{
		std::deque<token_base *> oldt, expr;
		std::swap(tokens, oldt);
		tokens.clear();
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::signal &&
			        static_cast<token_signal *>(ptr)->get_signal() == signal_types::endline_)
				ptr = new token_endline(ptr->get_line_num());
			if (ptr->get_type() == token_types::action || ptr->get_type() == token_types::endline) {
				if (!expr.empty()) {
					translator.match_grammar(context, expr);
					for (auto &it: expr)
						tokens.push_back(it);
					expr.clear();
				}
				tokens.push_back(ptr);
			}
			else
				expr.push_back(ptr);
		}
		std::deque<token_base *> tmp;
		for (auto &ptr: tokens) {
			tmp.push_back(ptr);
			if (ptr != nullptr && ptr->get_type() == token_types::endline) {
				if (tmp.size() > 1)
					ast.push_back(tmp);
				tmp.clear();
			}
		}
		if (tmp.size() > 1)
			ast.push_back(tmp);
	}